

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.cpp
# Opt level: O2

void __thiscall
SCCTest_DoublyLinkedList_Test::SCCTest_DoublyLinkedList_Test(SCCTest_DoublyLinkedList_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_002bcc90;
  return;
}

Assistant:

TEST(SCCTest, DoublyLinkedList) {
  // 0 <-> 1 <-> 2 <-> 3
  Graph graph(4);
  graph.addEdge(0, 1);
  graph.addEdge(1, 0);
  graph.addEdge(2, 3);
  graph.addEdge(3, 2);
  graph.addEdge(1, 2);
  // New from previous, combines SCCs.
  graph.addEdge(2, 1);
  EXPECT_EQ(getSCCs(graph), (SCCSet{{0, 1, 2, 3}}));
}